

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

XmlWriter * __thiscall
Catch::XmlWriter::writeComment(XmlWriter *this,string *text,XmlFormatting fmt)

{
  ostream *poVar1;
  ostream *poVar2;
  
  ensureTagClosed(this);
  if ((fmt & Indent) != None) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this->m_os,(this->m_indent)._M_dataplus._M_p,
               (this->m_indent)._M_string_length);
  }
  poVar1 = this->m_os;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<!--",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(text->_M_dataplus)._M_p,text->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-->",3);
  this->m_needsNewline = (bool)((byte)fmt >> 1 & 1);
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeComment( std::string const& text, XmlFormatting fmt) {
        ensureTagClosed();
        if (shouldIndent(fmt)) {
            m_os << m_indent;
        }
        m_os << "<!--" << text << "-->";
        applyFormatting(fmt);
        return *this;
    }